

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereAddLimitExpr(WhereClause *pWC,int iReg,Expr *pExpr,int iCsr,int eMatchOp)

{
  byte *pbVar1;
  Parse *pParse;
  sqlite3 *db;
  WhereTerm *pWVar2;
  int iVar3;
  int iVar4;
  Expr *pEVar5;
  int iVal;
  int local_44;
  Token local_40;
  
  pParse = pWC->pWInfo->pParse;
  db = pParse->db;
  local_44 = 0;
  iVar3 = sqlite3ExprIsInteger(pExpr,&local_44);
  iVar4 = local_44;
  if (local_44 < 0 || iVar3 == 0) {
    local_40.z = (char *)0x0;
    local_40.n = 0;
    pEVar5 = sqlite3ExprAlloc(db,0xb0,&local_40,0);
    if (pEVar5 == (Expr *)0x0) {
      return;
    }
    pEVar5->iTable = iReg;
    pEVar5 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar5);
  }
  else {
    local_40.z = (char *)0x0;
    local_40.n = 0;
    pEVar5 = sqlite3ExprAlloc(db,0x9b,&local_40,0);
    if (pEVar5 == (Expr *)0x0) {
      return;
    }
    pbVar1 = (byte *)((long)&pEVar5->flags + 1);
    *pbVar1 = *pbVar1 | 8;
    (pEVar5->u).iValue = iVar4;
    pEVar5 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar5);
  }
  if (pEVar5 != (Expr *)0x0) {
    iVar4 = whereClauseInsert(pWC,pEVar5,3);
    pWVar2 = pWC->a;
    pWVar2[iVar4].leftCursor = iCsr;
    pWVar2[iVar4].eOperator = 0x40;
    pWVar2[iVar4].eMatchOp = (u8)eMatchOp;
  }
  return;
}

Assistant:

static void whereAddLimitExpr(
  WhereClause *pWC,   /* Add the constraint to this WHERE clause */
  int iReg,           /* Register that will hold value of the limit/offset */
  Expr *pExpr,        /* Expression that defines the limit/offset */
  int iCsr,           /* Cursor to which the constraint applies */
  int eMatchOp        /* SQLITE_INDEX_CONSTRAINT_LIMIT or _OFFSET */
){
  Parse *pParse = pWC->pWInfo->pParse;
  sqlite3 *db = pParse->db;
  Expr *pNew;
  int iVal = 0;

  if( sqlite3ExprIsInteger(pExpr, &iVal) && iVal>=0 ){
    Expr *pVal = sqlite3Expr(db, TK_INTEGER, 0);
    if( pVal==0 ) return;
    ExprSetProperty(pVal, EP_IntValue);
    pVal->u.iValue = iVal;
    pNew = sqlite3PExpr(pParse, TK_MATCH, 0, pVal);
  }else{
    Expr *pVal = sqlite3Expr(db, TK_REGISTER, 0);
    if( pVal==0 ) return;
    pVal->iTable = iReg;
    pNew = sqlite3PExpr(pParse, TK_MATCH, 0, pVal);
  }
  if( pNew ){
    WhereTerm *pTerm;
    int idx;
    idx = whereClauseInsert(pWC, pNew, TERM_DYNAMIC|TERM_VIRTUAL);
    pTerm = &pWC->a[idx];
    pTerm->leftCursor = iCsr;
    pTerm->eOperator = WO_AUX;
    pTerm->eMatchOp = eMatchOp;
  }
}